

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node256_leaf.cpp
# Opt level: O2

array_ptr<unsigned_char,_true> __thiscall
duckdb::Node256Leaf::GetBytes(Node256Leaf *this,ArenaAllocator *arena)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t i;
  ulong uVar3;
  ulong index;
  array_ptr<unsigned_char,_true> aVar4;
  ValidityMask v_mask;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  undefined8 local_30;
  
  aVar4.ptr = ArenaAllocator::AllocateAligned(arena,(ulong)this->count);
  uVar1 = this->count;
  array_ptr<unsigned_char,_true>::AssertNotNull(aVar4.ptr == (data_ptr_t)0x0);
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_30 = 0x100;
  uVar2 = 0;
  for (uVar3 = 0; uVar3 != 0x100; uVar3 = uVar3 + 1) {
    if ((this->mask == (validity_t *)0x0) || ((this->mask[uVar3 >> 6] >> (uVar3 & 0x3f) & 1) != 0))
    {
      index = (ulong)uVar2;
      array_ptr<unsigned_char,_true>::AssertIndexInBounds(index,(ulong)uVar1);
      uVar2 = uVar2 + 1;
      aVar4.ptr[index] = (data_t)uVar3;
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  aVar4.count._0_2_ = uVar1;
  aVar4.count._2_6_ = 0;
  return aVar4;
}

Assistant:

array_ptr<uint8_t> Node256Leaf::GetBytes(ArenaAllocator &arena) {
	auto mem = arena.AllocateAligned(sizeof(uint8_t) * count);
	array_ptr<uint8_t> bytes(mem, count);

	ValidityMask v_mask(&mask[0], Node256::CAPACITY);
	uint16_t ptr_idx = 0;
	for (uint16_t i = 0; i < CAPACITY; i++) {
		if (v_mask.RowIsValid(i)) {
			bytes[ptr_idx++] = UnsafeNumericCast<uint8_t>(i);
		}
	}

	return bytes;
}